

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O1

MPP_RET hal_h264e_vepu2_get_task_v2(void *hal,HalEncTask *task)

{
  HalH264eVepuBufs *bufs;
  long lVar1;
  long lVar2;
  MPP_RET MVar3;
  int iVar4;
  MppBuffer buffer;
  MppBuffer buffer_00;
  RK_U32 RVar5;
  undefined8 *puVar6;
  uint uVar7;
  
  RVar5 = (task->syntax).number;
  if ((int)RVar5 < 1) {
    uVar7 = 0;
  }
  else {
    puVar6 = (undefined8 *)((long)(task->syntax).data + 8);
    uVar7 = 0;
    do {
      switch(*(undefined4 *)(puVar6 + -1)) {
      case 0:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu2_v2","update cfg","update_vepu2_syntax");
        }
        *(undefined8 *)hal = *puVar6;
        break;
      case 1:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu2_v2","update sps","update_vepu2_syntax");
        }
        *(undefined8 *)((long)hal + 0x260) = *puVar6;
        break;
      case 2:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu2_v2","update pps","update_vepu2_syntax");
        }
        *(undefined8 *)((long)hal + 0x268) = *puVar6;
        break;
      case 3:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu2_v2","update dpb","update_vepu2_syntax");
        }
        break;
      case 4:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu2_v2","update slice","update_vepu2_syntax");
        }
        *(undefined8 *)((long)hal + 0x270) = *puVar6;
        break;
      case 5:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu2_v2","update frames","update_vepu2_syntax");
        }
        *(undefined8 *)((long)hal + 0x278) = *puVar6;
        break;
      case 6:
        if (((byte)hal_h264e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h264e_vepu2_v2","update prefix nal","update_vepu2_syntax");
        }
        *(undefined8 *)((long)hal + 0x290) = *puVar6;
        break;
      default:
        _mpp_log_l(4,"hal_h264e_vepu2_v2","invalid syntax type %d\n","update_vepu2_syntax");
      }
      uVar7 = uVar7 | 1 << (*(byte *)(puVar6 + -1) & 0x1f);
      puVar6 = puVar6 + 2;
      RVar5 = RVar5 - 1;
    } while (RVar5 != 0);
  }
  lVar1 = *hal;
  lVar2 = *(long *)((long)hal + 0x278);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_get_task_v2",hal);
  }
  bufs = (HalH264eVepuBufs *)((long)hal + 0x18);
  if ((uVar7 & 1) != 0) {
    h264e_vepu_buf_set_frame_size(bufs,*(RK_S32 *)(lVar1 + 0xc),*(RK_S32 *)(lVar1 + 0x10));
    MVar3 = h264e_vepu_prep_setup
                      ((HalH264eVepuPrep *)((long)hal + 0xe0),(MppEncPrepCfg *)(lVar1 + 8));
    if (MVar3 != MPP_OK) {
      return MPP_NOK;
    }
    h264e_vepu_mbrc_setup(*(HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),*hal);
  }
  if ((uVar7 & 0x10) != 0) {
    h264e_vepu_buf_set_cabac_idc(bufs,*(RK_S32 *)(*(long *)((long)hal + 0x270) + 0x40));
  }
  h264e_vepu_prep_get_addr
            ((HalH264eVepuPrep *)((long)hal + 0xe0),task->input,(RK_U32 (*) [3])((long)hal + 0x148))
  ;
  buffer = h264e_vepu_buf_get_frame_buffer(bufs,*(RK_S32 *)(lVar2 + 4));
  buffer_00 = h264e_vepu_buf_get_frame_buffer(bufs,*(RK_S32 *)(lVar2 + 8));
  iVar4 = mpp_buffer_get_fd_with_caller(buffer,"hal_h264e_vepu2_get_task_v2");
  *(int *)((long)hal + 0x154) = iVar4;
  iVar4 = mpp_buffer_get_fd_with_caller(buffer_00,"hal_h264e_vepu2_get_task_v2");
  *(int *)((long)hal + 0x15c) = iVar4;
  *(undefined4 *)((long)hal + 0x158) = *(undefined4 *)((long)hal + 0x154);
  *(int *)((long)hal + 0x160) = iVar4;
  *(undefined4 *)((long)hal + 0x164) = *(undefined4 *)(lVar1 + 0x24);
  *(undefined4 *)((long)hal + 0x168) = *(undefined4 *)(lVar1 + 0xc);
  *(undefined4 *)((long)hal + 0x16c) = *(undefined4 *)(lVar1 + 0x10);
  *(undefined4 *)((long)hal + 0x170) = *(undefined4 *)(lVar1 + 0x14);
  *(undefined4 *)((long)hal + 0x174) = *(undefined4 *)(lVar1 + 0x18);
  RVar5 = mpp_frame_get_offset_x(task->frame);
  *(RK_U32 *)((long)hal + 0x178) = RVar5;
  RVar5 = mpp_frame_get_offset_y(task->frame);
  *(RK_U32 *)((long)hal + 0x17c) = RVar5;
  get_vepu_offset_cfg((VepuOffsetCfg *)((long)hal + 0x164));
  h264e_vepu_stream_amend_config
            ((HalH264eVepuStreamAmend *)((long)hal + 0x298),task->packet,*hal,
             *(H264eSlice **)((long)hal + 0x270),*(H264ePrefixNal **)((long)hal + 0x290));
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_get_task_v2",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu2_get_task_v2(void *hal, HalEncTask *task)
{
    HalH264eVepu2Ctx *ctx = (HalH264eVepu2Ctx *)hal;
    RK_U32 updated = update_vepu2_syntax(ctx, &task->syntax);
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    HalH264eVepuPrep *hw_prep = &ctx->hw_prep;
    HalH264eVepuAddr *hw_addr = &ctx->hw_addr;
    HalH264eVepuBufs *hw_bufs = &ctx->hw_bufs;
    VepuOffsetCfg *hw_offset = &ctx->hw_offset;
    H264eFrmInfo *frms = ctx->frms;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (updated & SYN_TYPE_FLAG(H264E_SYN_CFG)) {
        h264e_vepu_buf_set_frame_size(hw_bufs, prep->width, prep->height);

        /* preprocess setup */
        if (h264e_vepu_prep_setup(hw_prep, prep))
            return MPP_NOK;

        h264e_vepu_mbrc_setup(ctx->rc_ctx, ctx->cfg);
    }

    if (updated & SYN_TYPE_FLAG(H264E_SYN_SLICE)) {
        H264eSlice *slice = ctx->slice;

        h264e_vepu_buf_set_cabac_idc(hw_bufs, slice->cabac_init_idc);
    }

    h264e_vepu_prep_get_addr(hw_prep, task->input, &hw_addr->orig);

    MppBuffer recn = h264e_vepu_buf_get_frame_buffer(hw_bufs, frms->curr_idx);
    MppBuffer refr = h264e_vepu_buf_get_frame_buffer(hw_bufs, frms->refr_idx);

    hw_addr->recn[0] = mpp_buffer_get_fd(recn);
    hw_addr->refr[0] = mpp_buffer_get_fd(refr);
    hw_addr->recn[1] = hw_addr->recn[0];
    hw_addr->refr[1] = hw_addr->refr[0];

    hw_offset->fmt = prep->format;
    hw_offset->width = prep->width;
    hw_offset->height = prep->height;
    hw_offset->hor_stride = prep->hor_stride;
    hw_offset->ver_stride = prep->ver_stride;
    hw_offset->offset_x = mpp_frame_get_offset_x(task->frame);
    hw_offset->offset_y = mpp_frame_get_offset_y(task->frame);

    get_vepu_offset_cfg(hw_offset);

    h264e_vepu_stream_amend_config(&ctx->amend, task->packet, ctx->cfg,
                                   ctx->slice, ctx->prefix);

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}